

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# clean.c
# Opt level: O0

void prvTidyFixLanguageInformation(TidyDocImpl *doc,Node *node,Bool wantXmlLang,Bool wantLang)

{
  Node *pNVar1;
  Bool BVar2;
  uint uVar3;
  AttVal *attr;
  AttVal *attr_00;
  AttVal *xmlLang;
  AttVal *lang;
  Node *next;
  Bool wantLang_local;
  Bool wantXmlLang_local;
  Node *node_local;
  TidyDocImpl *doc_local;
  
  pNVar1 = node;
  while (_wantLang_local = pNVar1, _wantLang_local != (Node *)0x0) {
    pNVar1 = _wantLang_local->next;
    BVar2 = prvTidynodeIsElement(_wantLang_local);
    if (BVar2 != no) {
      attr = prvTidyAttrGetById(_wantLang_local,TidyAttr_LANG);
      attr_00 = prvTidyAttrGetById(_wantLang_local,TidyAttr_XML_LANG);
      if ((attr == (AttVal *)0x0) || (attr_00 == (AttVal *)0x0)) {
        if ((attr == (AttVal *)0x0) || (wantXmlLang == no)) {
          if (((attr_00 != (AttVal *)0x0) && (wantLang != no)) &&
             (uVar3 = prvTidyNodeAttributeVersions(_wantLang_local,TidyAttr_LANG),
             (uVar3 & doc->lexer->versionEmitted) != 0)) {
            prvTidyRepairAttrValue(doc,_wantLang_local,"lang",attr_00->value);
          }
        }
        else {
          uVar3 = prvTidyNodeAttributeVersions(_wantLang_local,TidyAttr_XML_LANG);
          if ((uVar3 & doc->lexer->versionEmitted) != 0) {
            prvTidyRepairAttrValue(doc,_wantLang_local,"xml:lang",attr->value);
          }
        }
      }
      if ((attr != (AttVal *)0x0) && (wantLang == no)) {
        prvTidyRemoveAttribute(doc,_wantLang_local,attr);
      }
      if ((attr_00 != (AttVal *)0x0) && (wantXmlLang == no)) {
        prvTidyRemoveAttribute(doc,_wantLang_local,attr_00);
      }
    }
    if (_wantLang_local->content != (Node *)0x0) {
      prvTidyFixLanguageInformation(doc,_wantLang_local->content,wantXmlLang,wantLang);
    }
  }
  return;
}

Assistant:

void TY_(FixLanguageInformation)(TidyDocImpl* doc, Node* node, Bool wantXmlLang, Bool wantLang)
{
    Node* next;

    while (node)
    {
        next = node->next;

        /* todo: report modifications made here to the report system */

        if (TY_(nodeIsElement)(node))
        {
            AttVal* lang = TY_(AttrGetById)(node, TidyAttr_LANG);
            AttVal* xmlLang = TY_(AttrGetById)(node, TidyAttr_XML_LANG);

            if (lang && xmlLang)
            {
                /*
                  todo: check whether both attributes are in sync,
                  here or elsewhere, where elsewhere is probably
                  preferable.
                  AD - March 2005: not mandatory according the standards.
                */
            }
            else if (lang && wantXmlLang)
            {
                if (TY_(NodeAttributeVersions)( node, TidyAttr_XML_LANG )
                    & doc->lexer->versionEmitted)
                    TY_(RepairAttrValue)(doc, node, "xml:lang", lang->value);
            }
            else if (xmlLang && wantLang)
            {
                if (TY_(NodeAttributeVersions)( node, TidyAttr_LANG )
                    & doc->lexer->versionEmitted)
                    TY_(RepairAttrValue)(doc, node, "lang", xmlLang->value);
            }

            if (lang && !wantLang)
                TY_(RemoveAttribute)(doc, node, lang);
            
            if (xmlLang && !wantXmlLang)
                TY_(RemoveAttribute)(doc, node, xmlLang);
        }

        if (node->content)
            TY_(FixLanguageInformation)(doc, node->content, wantXmlLang, wantLang);

        node = next;
    }
}